

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_chunk_append(uchar **out,size_t *outlength,uchar *chunk)

{
  long lVar1;
  uint uVar2;
  void *ptr;
  void *pvVar3;
  long in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  size_t new_length;
  uchar *new_buffer;
  uchar *chunk_start;
  uint total_chunk_length;
  uint i;
  size_t in_stack_ffffffffffffffb8;
  uint local_24;
  uint local_4;
  
  uVar2 = lodepng_chunk_length((uchar *)0x12823d);
  uVar2 = uVar2 + 0xc;
  ptr = (void *)(*in_RSI + (ulong)uVar2);
  if ((ptr < (void *)(ulong)uVar2) || (ptr < (void *)*in_RSI)) {
    local_4 = 0x4d;
  }
  else {
    pvVar3 = lodepng_realloc(ptr,in_stack_ffffffffffffffb8);
    if (pvVar3 == (void *)0x0) {
      local_4 = 0x53;
    }
    else {
      *in_RDI = (long)pvVar3;
      *in_RSI = (ulong)ptr;
      lVar1 = *in_RDI;
      for (local_24 = 0; local_24 != uVar2; local_24 = local_24 + 1) {
        *(undefined1 *)((long)ptr + (ulong)local_24 + (lVar1 - (ulong)uVar2)) =
             *(undefined1 *)(in_RDX + (ulong)local_24);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outlength, const unsigned char* chunk) {
  unsigned i;
  unsigned total_chunk_length = lodepng_chunk_length(chunk) + 12;
  unsigned char *chunk_start, *new_buffer;
  size_t new_length = (*outlength) + total_chunk_length;
  if(new_length < total_chunk_length || new_length < (*outlength)) return 77; /*integer overflow happened*/

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outlength) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}